

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha0.c
# Opt level: O1

t1ha0_function_t t1ha0_resolve(void)

{
  uint *puVar1;
  long lVar2;
  t1ha0_function_t p_Var3;
  t1ha0_function_t p_Var4;
  uint uVar5;
  code *pcVar6;
  
  uVar5 = 0;
  puVar1 = (uint *)cpuid_basic_info(0);
  pcVar6 = t1ha0_ia32aes_avx;
  if (*puVar1 != 0) {
    lVar2 = cpuid_Version_info(1);
    uVar5 = *(uint *)(lVar2 + 0xc);
    if (6 < *puVar1) {
      lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
      pcVar6 = t1ha0_ia32aes_avx2;
      if ((*(uint *)(lVar2 + 4) & 0x20) == 0) {
        pcVar6 = t1ha0_ia32aes_avx;
      }
    }
  }
  p_Var4 = t1ha0_ia32aes_noavx;
  if ((~uVar5 & 0x1a000000) == 0) {
    p_Var4 = pcVar6;
  }
  p_Var3 = t1ha1_le;
  if ((uVar5 >> 0x19 & 1) != 0) {
    p_Var3 = p_Var4;
  }
  return p_Var3;
}

Assistant:

t1ha0_resolve(void) {

#if T1HA0_AESNI_AVAILABLE && defined(__ia32__)
  uint64_t features = x86_cpu_features();
  if (features & UINT32_C(0x02000000) /* check for AES-NI */) {
    if ((features & UINT32_C(0x1A000000)) ==
        UINT32_C(0x1A000000) /* check for any AVX */)
      /* check for 'Advanced Vector Extensions 2' */
      return ((features >> 32) & 32) ? t1ha0_ia32aes_avx2 : t1ha0_ia32aes_avx;
    return t1ha0_ia32aes_noavx;
  }
#endif /* T1HA0_AESNI_AVAILABLE && __ia32__ */

#if __BYTE_ORDER__ == __ORDER_BIG_ENDIAN__
#if (UINTPTR_MAX > 0xffffFFFFul || ULONG_MAX > 0xffffFFFFul) &&                \
    (!defined(T1HA1_DISABLED) || !defined(T1HA2_DISABLED))
#ifndef T1HA1_DISABLED
  return t1ha1_be;
#else
  return t1ha2_atonce;
#endif /* T1HA1_DISABLED */
#else
  return t1ha0_32be;
#endif
#else /* __BYTE_ORDER__ != __ORDER_BIG_ENDIAN__ */
#if (UINTPTR_MAX > 0xffffFFFFul || ULONG_MAX > 0xffffFFFFul) &&                \
    (!defined(T1HA1_DISABLED) || !defined(T1HA2_DISABLED))
#ifndef T1HA1_DISABLED
  return t1ha1_le;
#else
  return t1ha2_atonce;
#endif /* T1HA1_DISABLED */
#else
  return t1ha0_32le;
#endif
#endif /* __BYTE_ORDER__ */
}